

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndEaRg<(moira::Instr)9,(moira::Mode)3,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  ulong uVar3;
  uint uVar4;
  u32 data;
  u32 ea;
  uint local_20;
  u32 local_1c;
  
  bVar1 = readOp<(moira::Mode)3,(moira::Size)4,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar1) {
    uVar3 = (ulong)(opcode >> 9 & 7);
    uVar4 = *(uint *)((long)this->exec + uVar3 * 4 + -0x58) & local_20;
    (this->reg).sr.n = SUB41(uVar4 >> 0x1f,0);
    (this->reg).sr.z = uVar4 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    (*this->_vptr_Moira[0x19])(this,2);
    *(uint *)((long)this->exec + uVar3 * 4 + -0x58) = uVar4;
  }
  return;
}

Assistant:

void
Moira::execAndEaRg(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    u32 result = logic<I,S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(isRegMode(M) || isImmMode(M) ? 4 : 2);
    writeD<S>(dst, result);
}